

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

int lnewconf(lua_State *L)

{
  int iVar1;
  lua_State *plVar2;
  table *tbl;
  char *s;
  undefined8 *puVar3;
  lua_Integer lVar4;
  context ctx;
  size_t sz;
  lua_State *local_48;
  table *local_40;
  int local_38;
  size_t local_30;
  
  luaL_checktype(L,1,5);
  plVar2 = luaL_newstate();
  local_40 = (table *)0x0;
  local_38 = 1;
  local_48 = plVar2;
  if (plVar2 != (lua_State *)0x0) {
    tbl = (table *)malloc(0x28);
    if (tbl != (table *)0x0) {
      tbl->array = (value *)0x0;
      tbl->hash = (node *)0x0;
      tbl->sizearray = 0;
      tbl->sizehash = 0;
      tbl->arraytype = (uint8_t *)0x0;
      tbl->L = (lua_State *)0x0;
      local_40 = tbl;
      lua_pushcclosure(plVar2,pconv,0);
      lua_pushlightuserdata(local_48,&local_48);
      lua_pushlightuserdata(local_48,L);
      iVar1 = lua_pcallk(local_48,2,1,0,0,(lua_KFunction)0x0);
      plVar2 = local_48;
      if (iVar1 == 0) {
        lua_checkstack(local_48,local_38 + 0x14);
        lua_settop(plVar2,local_38 + 1);
        lua_pushvalue(plVar2,1);
        puVar3 = (undefined8 *)lua_newuserdata(plVar2,0x10);
        *puVar3 = 0;
        puVar3[1] = tbl;
        lua_copy(plVar2,-1,1);
        lua_settop(plVar2,-2);
        lua_copy(plVar2,-1,-2);
        lua_settop(plVar2,-2);
        lua_pushnil(plVar2);
        while (iVar1 = lua_next(plVar2,-2), iVar1 != 0) {
          lVar4 = lua_tointegerx(plVar2,-1,(int *)0x0);
          lua_settop(plVar2,-2);
          lua_pushvalue(plVar2,-1);
          lua_copy(plVar2,-1,(int)lVar4);
          lua_settop(plVar2,-2);
        }
        lua_settop(plVar2,-2);
        lua_gc(plVar2,2,0);
        lua_pushlightuserdata(L,tbl);
        return 1;
      }
      local_30 = 0;
      s = lua_tolstring(local_48,-1,&local_30);
      lua_pushlstring(L,s,local_30);
      goto LAB_00123a19;
    }
    lua_close(plVar2);
    local_48 = (lua_State *)0x0;
  }
  lua_pushstring(L,"memory error");
  tbl = (table *)0x0;
LAB_00123a19:
  if (local_48 != (lua_State *)0x0) {
    lua_close(local_48);
  }
  if (tbl != (table *)0x0) {
    delete_tbl(tbl);
  }
  lua_error(L);
  return -1;
}

Assistant:

static int
lnewconf(lua_State *L) {
	int ret;
	struct context ctx;
	struct table * tbl = NULL;
	luaL_checktype(L,1,LUA_TTABLE);
	ctx.L = luaL_newstate();
	ctx.tbl = NULL;
	ctx.string_index = 1;	// 1 reserved for dirty flag
	if (ctx.L == NULL) {
		lua_pushliteral(L, "memory error");
		goto error;
	}
	tbl = (struct table *)malloc(sizeof(struct table));
	if (tbl == NULL) {
		// lua_pushliteral may fail because of memory error, close first.
		lua_close(ctx.L);
		ctx.L = NULL;
		lua_pushliteral(L, "memory error");
		goto error;
	}
	memset(tbl, 0, sizeof(struct table));
	ctx.tbl = tbl;

	lua_pushcfunction(ctx.L, pconv);
	lua_pushlightuserdata(ctx.L , &ctx);
	lua_pushlightuserdata(ctx.L , L);

	ret = lua_pcall(ctx.L, 2, 1, 0);

	if (ret != LUA_OK) {
		size_t sz = 0;
		const char * error = lua_tolstring(ctx.L, -1, &sz);
		lua_pushlstring(L, error, sz);
		goto error;
	}

	convert_stringmap(&ctx, tbl);

	lua_pushlightuserdata(L, tbl);	

	return 1;
error:
	if (ctx.L) {
		lua_close(ctx.L);
	}
	if (tbl) {
		delete_tbl(tbl);
	}
	lua_error(L);
	return -1;
}